

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

void checksum_init(chksumwork_conflict *sumwrk,sumalg sum_alg)

{
  archive_digest *paVar1;
  long lStack_8;
  
  sumwrk->alg = sum_alg;
  paVar1 = &__archive_digest;
  if (sum_alg == CKSUM_SHA1) {
    paVar1 = (archive_digest *)&__archive_digest.sha1init;
    lStack_8 = 0x10;
  }
  else {
    if (sum_alg != CKSUM_MD5) {
      return;
    }
    lStack_8 = 8;
  }
  (*paVar1->md5init)((archive_sha1_ctx *)((long)&sumwrk->alg + lStack_8));
  return;
}

Assistant:

static void
checksum_init(struct chksumwork *sumwrk, enum sumalg sum_alg)
{
	sumwrk->alg = sum_alg;
	switch (sum_alg) {
	case CKSUM_NONE:
		break;
	case CKSUM_SHA1:
		archive_sha1_init(&(sumwrk->sha1ctx));
		break;
	case CKSUM_MD5:
		archive_md5_init(&(sumwrk->md5ctx));
		break;
	}
}